

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp2.c
# Opt level: O3

ReturnCode control(Global *global,int *counter)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ReturnCode RVar5;
  undefined8 in_RAX;
  ushort **ppuVar6;
  char *pcVar7;
  byte bVar8;
  ErrorCode EVar9;
  char *pcVar10;
  int hash;
  int result;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  iVar2 = skipws(global);
  if ((iVar2 == 10) || (iVar2 == 0)) goto LAB_001036ec;
  ppuVar6 = __ctype_b_loc();
  if ((*(byte *)((long)*ppuVar6 + (long)iVar2 * 2 + 1) & 8) == 0) {
    scanid(global,iVar2);
  }
  else {
    unget(global);
    builtin_strncpy(global->tokenbuf,"line",5);
  }
  pcVar7 = global->tokenbuf;
  if (pcVar7[1] == '\0') {
switchD_00103273_caseD_12e:
    iVar2 = 0;
    pcVar10 = "";
  }
  else {
    iVar2 = (int)*pcVar7 + pcVar7[2] * 2;
    switch((int)*pcVar7 + pcVar7[2] * 2) {
    case 0x12d:
      pcVar10 = "endif";
      break;
    case 0x12e:
    case 0x133:
    case 0x134:
    case 0x135:
    case 0x136:
    case 0x138:
    case 0x139:
    case 0x13a:
    case 0x13b:
    case 0x13c:
      goto switchD_00103273_caseD_12e;
    case 0x12f:
      pcVar10 = "include";
      break;
    case 0x130:
      pcVar10 = "define";
      break;
    case 0x131:
      pcVar10 = "ifdef";
      break;
    case 0x132:
      pcVar10 = "pragma";
      break;
    case 0x137:
      pcVar10 = "elif";
      break;
    case 0x13d:
      pcVar10 = "undef";
      break;
    default:
      switch(iVar2) {
      case 0x145:
        pcVar10 = "ifndef";
        break;
      case 0x146:
      case 0x14a:
        goto switchD_00103273_caseD_12e;
      case 0x147:
        pcVar10 = "assert";
        break;
      case 0x148:
        pcVar10 = "line";
        break;
      case 0x149:
        pcVar10 = "error";
        break;
      case 0x14b:
        pcVar10 = "else";
        break;
      default:
        if (iVar2 != 0x69) goto switchD_00103273_caseD_12e;
        pcVar10 = "if";
      }
    }
  }
  iVar3 = strcmp(pcVar10,pcVar7);
  hash = 0;
  if (iVar3 == 0) {
    hash = iVar2;
  }
  if (global->infile->fp == (FILE *)0x0) {
    cerror(global,WARN_CONTROL_LINE_IN_MACRO,pcVar7);
  }
  if (global->ifstack[0] == '\0') {
    uVar4 = hash - 0x12f;
    if (uVar4 < 0x1b) {
      if ((0x700400bU >> (uVar4 & 0x1f) & 1) == 0) {
        if ((0x400004U >> (uVar4 & 0x1f) & 1) == 0) goto LAB_00103341;
        goto LAB_00103347;
      }
    }
    else {
LAB_00103341:
      if (hash != 0x69) goto LAB_001032f1;
LAB_00103347:
      pcVar7 = global->ifptr + 1;
      global->ifptr = pcVar7;
      if (&global->field_0x275 <= pcVar7) goto LAB_0010348b;
      *pcVar7 = '\0';
    }
    goto LAB_001036e4;
  }
LAB_001032f1:
  pcVar7 = global->ifstack;
  if (0 < *counter) {
    switch(hash) {
    case 0x12d:
      goto switchD_0010331b_caseD_12d;
    case 0x12e:
    case 0x133:
    case 0x134:
    case 0x135:
    case 0x136:
    case 0x138:
    case 0x139:
    case 0x13a:
    case 0x13b:
    case 0x13c:
      goto switchD_0010331b_caseD_12e;
    case 0x12f:
      goto switchD_0010331b_caseD_12f;
    case 0x130:
      goto switchD_0010331b_caseD_130;
    case 0x131:
      goto switchD_0010331b_caseD_131;
    case 0x132:
switchD_0010331b_caseD_132:
      Putchar(global,10);
      *counter = *counter + -1;
      break;
    case 0x137:
      goto switchD_0010331b_caseD_137;
    case 0x13d:
      goto switchD_0010331b_caseD_13d;
    default:
      switch(hash) {
      case 0x145:
        goto switchD_0010331b_caseD_131;
      case 0x146:
      case 0x14a:
        goto switchD_0010331b_caseD_12e;
      case 0x147:
        goto switchD_0010338e_caseD_147;
      case 0x148:
        goto switchD_0010331b_caseD_132;
      case 0x149:
        goto switchD_0010338e_caseD_149;
      case 0x14b:
        goto switchD_0010338e_caseD_14b;
      default:
        goto switchD_0010338e_default;
      }
    }
  }
  switch(hash) {
  case 0x12d:
switchD_0010331b_caseD_12d:
    pbVar1 = (byte *)global->ifptr;
    if (pbVar1 == (byte *)pcVar7) {
LAB_001035d5:
      pcVar7 = global->tokenbuf;
      EVar9 = ERROR_STRING_MUST_BE_IF;
LAB_0010366b:
      cerror(global,EVar9,pcVar7);
      skipnl(global);
      *counter = *counter + 1;
      return FPP_OK;
    }
    bVar8 = *pbVar1;
    if ((bVar8 & 1) != 0 && *pcVar7 == '\0') {
      global->wrongline = 1;
      bVar8 = *pbVar1;
    }
    global->ifstack[0] = bVar8 & 1;
    global->ifptr = (char *)(pbVar1 + -1);
    break;
  case 0x12e:
  case 0x133:
  case 0x134:
  case 0x135:
  case 0x136:
  case 0x138:
  case 0x139:
  case 0x13a:
  case 0x13b:
  case 0x13c:
    goto switchD_0010331b_caseD_12e;
  case 0x12f:
switchD_0010331b_caseD_12f:
    RVar5 = doinclude(global);
    if (RVar5 != FPP_OK) {
      return RVar5;
    }
    goto LAB_001036ec;
  case 0x130:
switchD_0010331b_caseD_130:
    RVar5 = dodefine(global);
    goto LAB_00103531;
  case 0x131:
switchD_0010331b_caseD_131:
    pcVar7 = global->ifptr + 1;
    global->ifptr = pcVar7;
    if (&global->field_0x275 <= pcVar7) {
LAB_0010348b:
      cerror(global,FATAL_TOO_MANY_NESTINGS,global->tokenbuf);
      return FPP_TOO_MANY_NESTED_STATEMENTS;
    }
    *pcVar7 = '\x01';
    RVar5 = doif(global,hash);
    if (RVar5 != FPP_OK) {
      return RVar5;
    }
    goto LAB_001036bf;
  case 0x132:
    Putstring(global,"#pragma ");
    while ((iVar2 = get(global), iVar2 != 0 && (iVar2 != 10))) {
      Putchar(global,iVar2);
    }
    goto LAB_001036aa;
  case 0x137:
switchD_0010331b_caseD_137:
    if (global->ifptr == pcVar7) goto LAB_001035d5;
    bVar8 = *global->ifptr;
    if ((bVar8 & 2) != 0) {
LAB_0010365d:
      pcVar7 = global->tokenbuf;
      EVar9 = ERROR_STRING_MAY_NOT_FOLLOW_ELSE;
      goto LAB_0010366b;
    }
    if ((bVar8 & 5) != 1) {
      global->ifstack[0] = '\0';
      goto LAB_001036e4;
    }
    RVar5 = doif(global,0x69);
LAB_00103531:
    if (RVar5 != FPP_OK) {
      return RVar5;
    }
    break;
  case 0x13d:
switchD_0010331b_caseD_13d:
    doundef(global);
    break;
  default:
    switch(hash) {
    case 0x145:
      goto switchD_0010331b_caseD_131;
    case 0x146:
    case 0x14a:
      break;
    case 0x147:
      goto switchD_0010338e_caseD_147;
    case 0x148:
      iVar2 = skipws(global);
      pcVar7 = global->work;
      global->workp = pcVar7;
      while ((iVar2 != 0 && (iVar2 != 10))) {
        RVar5 = save(global,iVar2);
        if (RVar5 != FPP_OK) {
          return RVar5;
        }
        iVar2 = get(global);
      }
      unget(global);
      RVar5 = save(global,0);
      if (RVar5 != FPP_OK) {
        return RVar5;
      }
      iVar2 = atoi(pcVar7);
      global->line = iVar2 + -1;
      while ((bVar8 = *pcVar7, (*(byte *)((long)*ppuVar6 + (long)(char)bVar8 * 2 + 1) & 8) != 0 ||
             (type[bVar8] == 'C'))) {
        pcVar7 = pcVar7 + 1;
      }
      if ((ulong)bVar8 != 0) {
        if (bVar8 == 0x22) {
          pcVar10 = strrchr(pcVar7 + 1,0x22);
          if (pcVar10 != (char *)0x0) {
            *pcVar10 = '\0';
            pcVar7 = pcVar7 + 1;
          }
        }
        pcVar10 = global->infile->progname;
        if (pcVar10 != (char *)0x0) {
          Freemem(pcVar10);
        }
        pcVar7 = savestring(global,pcVar7);
        global->infile->progname = pcVar7;
      }
      global->wrongline = 1;
      goto LAB_001036bf;
    case 0x149:
switchD_0010338e_caseD_149:
      EVar9 = ERROR_ERROR;
      goto LAB_0010357e;
    case 0x14b:
switchD_0010338e_caseD_14b:
      pbVar1 = (byte *)global->ifptr;
      if (pbVar1 != (byte *)pcVar7) {
        if ((*pbVar1 & 2) == 0) {
          *pbVar1 = *pbVar1 | 2;
          if ((*global->ifptr & 1U) != 0) {
            if (((*global->ifptr & 4U) == 0) && (*pcVar7 == '\0')) {
              *pcVar7 = '\x01';
            }
            else {
              *pcVar7 = '\0';
            }
          }
          goto LAB_001036c8;
        }
        goto LAB_0010365d;
      }
      goto LAB_001035d5;
    default:
switchD_0010338e_default:
      if (hash == 0x69) goto switchD_0010331b_caseD_131;
    }
    goto switchD_0010331b_caseD_12e;
  }
  goto LAB_001036c8;
switchD_0010338e_caseD_147:
  RVar5 = eval(global,&local_34);
  if (RVar5 != FPP_OK) {
    return RVar5;
  }
  if (local_34 == 0) {
    EVar9 = ERROR_PREPROC_FAILURE;
LAB_0010357e:
    cerror(global,EVar9);
  }
  goto LAB_001036c8;
switchD_0010331b_caseD_12e:
  if (global->warnillegalcpp != '\0') {
    cerror(global,WARN_ILLEGAL_COMMAND,global->tokenbuf);
  }
  Putchar(global,0x23);
  Putstring(global,global->tokenbuf);
  iVar2 = 0x20;
  do {
    Putchar(global,iVar2);
    iVar2 = get(global);
    if (iVar2 == 0) break;
  } while (iVar2 != 10);
LAB_001036aa:
  unget(global);
  Putchar(global,10);
LAB_001036bf:
  if (hash == 0x12f) goto LAB_001036ec;
LAB_001036c8:
  iVar2 = skipws(global);
  if (iVar2 != 10) {
    cerror(global,WARN_UNEXPECTED_TEXT_IGNORED);
LAB_001036e4:
    skipnl(global);
  }
LAB_001036ec:
  *counter = *counter + 1;
  return FPP_OK;
}

Assistant:

ReturnCode control( struct Global *global,
    int *counter )  /* Pending newline counter */
{
    /*
     * Process #control lines.  Simple commands are processed inline,
     * while complex commands have their own subroutines.
     *
     * The counter is used to force out a newline before #line, and
     * #pragma commands.  This prevents these commands from ending up at
     * the end of the previous line if cpp is invoked with the -C option.
     */

    int c;
    char *tp;
    int hash;
    char *ep;
    ReturnCode ret;

    c = skipws( global );

    if( c == '\n' || c == EOF_CHAR )
        {
        (*counter)++;

        return(FPP_OK);
        }

    if( !isdigit(c) )
        scanid( global, c );                  /* Get #word to tokenbuf        */
    else
        {
        unget( global );                    /* Hack -- allow #123 as a      */

        strcpy( global->tokenbuf, "line" );   /* synonym for #line 123        */
        }

    hash = (global->tokenbuf[1] == EOS) ? L_nogood : (global->tokenbuf[0] + (global->tokenbuf[2] << 1));

    switch( hash )
        {
        case L_assert:
            tp = "assert";
            break;
        case L_define:
            tp = "define";
            break;
        case L_elif:
            tp = "elif";
            break;
        case L_else:
            tp = "else";
            break;
        case L_endif:
            tp = "endif";
            break;
        case L_error:
            tp = "error";
            break;
        case L_if:
            tp = "if";
            break;
        case L_ifdef:
            tp = "ifdef";
            break;
        case L_ifndef:
            tp = "ifndef";
            break;
        case L_include:
            tp = "include";
            break;
        case L_line:
            tp = "line";
            break;
        case L_pragma:
            tp = "pragma";
            break;
        case L_undef:
            tp = "undef";
            break;
        default:
            hash = L_nogood;
        case L_nogood:
            tp = "";
            break;
        }

    if( !streq( tp, global->tokenbuf ) )
        hash = L_nogood;

    /*
     * hash is set to a unique value corresponding to the
     * control keyword (or L_nogood if we think it's nonsense).
     */
    if( global->infile->fp == NULL )
        cwarn( global, WARN_CONTROL_LINE_IN_MACRO, global->tokenbuf );

    if( !compiling )
        {                       /* Not compiling now    */
        switch( hash )
            {
            case L_if:              /* These can't turn     */
            case L_ifdef:           /*  compilation on, but */
            case L_ifndef:          /*   we must nest #if's */
                if( ++global->ifptr >= &global->ifstack[BLK_NEST] )
                    {
                    cfatal( global, FATAL_TOO_MANY_NESTINGS, global->tokenbuf );

                    return( FPP_TOO_MANY_NESTED_STATEMENTS );
                    }

                *global->ifptr = 0;       /* !WAS_COMPILING   */

            case L_line:            /* Many         */
                /*
                 * Are pragma's always processed?
                 */
            case L_pragma:          /*  options     */
            case L_include:         /*   are uninteresting  */
            case L_define:          /*    if we     */
            case L_undef:           /*     aren't           */
            case L_assert:          /*  compiling.  */
            case L_error:
                dump_line( global, counter );       /* Ignore rest of line  */
                return(FPP_OK);
            }
        }
    /*
     * Make sure that #line and #pragma are output on a fresh line.
     */
    if( *counter > 0 && (hash == L_line || hash == L_pragma) )
        {
        Putchar( global, '\n' );

        (*counter)--;
        }

    switch( hash )
        {
        case L_line:
            /*
             * Parse the line to update the line number and "progname"
             * field and line number for the next input line.
             * Set wrongline to force it out later.
             */
            c = skipws( global );

            global->workp = global->work;       /* Save name in work    */

            while( c != '\n' && c != EOF_CHAR )
                {
                if( (ret = save( global, c )) )
                    return(ret);

                c = get( global );
                }

            unget( global );

            if( (ret = save( global, EOS )) )
                return(ret);

            /*
             * Split #line argument into <line-number> and <name>
             * We subtract 1 as we want the number of the next line.
             */
            global->line = atoi(global->work) - 1;     /* Reset line number    */

            for( tp = global->work; isdigit(*tp) || type[(uint8_t)*tp] == SPA; tp++)
                ;             /* Skip over digits */

            if( *tp != EOS )
                {
                /* Got a filename, so:  */

                if( *tp == '"' && (ep = strrchr(tp + 1, '"')) != NULL )
                    {
                    tp++;           /* Skip over left quote */

                    *ep = EOS;      /* And ignore right one */
                    }

                if( global->infile->progname != NULL )
                    /* Give up the old name if it's allocated.   */
                    Freemem( global->infile->progname );

                global->infile->progname = savestring( global, tp );
                }

            global->wrongline = TRUE;           /* Force output later   */
            break;

        case L_include:
            ret = doinclude( global );
            if( ret )
                return(ret);
            break;

        case L_define:
            ret = dodefine( global );
            if( ret )
                return(ret);
            break;

        case L_undef:
            doundef( global );
            break;

        case L_else:
            if( global->ifptr == &global->ifstack[0] )
                {
                cerror( global, ERROR_STRING_MUST_BE_IF, global->tokenbuf );

                dump_line( global, counter );

                return( FPP_OK );
                }
            else if( (*global->ifptr & ELSE_SEEN) != 0 )
                {
                cerror( global, ERROR_STRING_MAY_NOT_FOLLOW_ELSE, global->tokenbuf );

                dump_line( global, counter );

                return( FPP_OK );
                }

            *global->ifptr |= ELSE_SEEN;

            if( (*global->ifptr & WAS_COMPILING) != 0 )
                {
                if( compiling || (*global->ifptr & TRUE_SEEN) != 0 )
                    compiling = FALSE;
                else
                    {
                    compiling = TRUE;
                    }
                }
            break;

        case L_elif:
            if( global->ifptr == &global->ifstack[0] )
                {
                cerror( global, ERROR_STRING_MUST_BE_IF, global->tokenbuf );

                dump_line( global, counter );

                return( FPP_OK );
                }
            else if( (*global->ifptr & ELSE_SEEN) != 0 )
                {
                cerror( global, ERROR_STRING_MAY_NOT_FOLLOW_ELSE, global->tokenbuf );

                dump_line( global, counter );

                return( FPP_OK );
                }

            if( (*global->ifptr & (WAS_COMPILING | TRUE_SEEN)) != WAS_COMPILING )
                {
                compiling = FALSE;        /* Done compiling stuff */

                dump_line( global, counter );   /* Skip this clause */

                return( FPP_OK );
                }

            ret = doif( global, L_if );

            if( ret )
                return(ret);

            break;

        case L_error:
            cerror(global, ERROR_ERROR);
            break;

        case L_if:
        case L_ifdef:
        case L_ifndef:
            if( ++global->ifptr < &global->ifstack[BLK_NEST] )
                {
                *global->ifptr = WAS_COMPILING;

                ret = doif( global, hash );

                if( ret )
                    return(ret);

                break;
                }

            cfatal( global, FATAL_TOO_MANY_NESTINGS, global->tokenbuf );

            return( FPP_TOO_MANY_NESTED_STATEMENTS );

        case L_endif:
            if( global->ifptr == &global->ifstack[0] )
                {
                cerror( global, ERROR_STRING_MUST_BE_IF, global->tokenbuf );

                dump_line( global, counter );

                return(FPP_OK);
                }

            if( !compiling && (*global->ifptr & WAS_COMPILING) != 0 )
                global->wrongline = TRUE;

            compiling = ((*global->ifptr & WAS_COMPILING) != 0);

            --global->ifptr;

            break;

        case L_assert:
            {
            int result;

            ret = eval( global, &result );

            if(ret)
                return(ret);

            if( result == 0 )
                cerror( global, ERROR_PREPROC_FAILURE );
            }
            break;

        case L_pragma:
            /*
             * #pragma is provided to pass "options" to later
             * passes of the compiler.  cpp doesn't have any yet.
             */
            Putstring( global, "#pragma " );

            while( (c = get( global ) ) != '\n' && c != EOF_CHAR )
                Putchar( global, c );

            unget( global );

            Putchar( global, '\n' );

            break;

        default:
            /*
             * Undefined #control keyword.
             * Note: the correct behavior may be to warn and
             * pass the line to a subsequent compiler pass.
             * This would allow #asm or similar extensions.
             */
            if( global->warnillegalcpp )
                cwarn( global, WARN_ILLEGAL_COMMAND, global->tokenbuf );

            Putchar( global, '#' );
            Putstring( global, global->tokenbuf );
            Putchar( global, ' ' );

            while( (c = get( global ) ) != '\n' && c != EOF_CHAR )
                Putchar( global, c );

            unget( global );

            Putchar( global, '\n' );

            break;
        }

    if( hash != L_include )
        {
        #if OLD_PREPROCESSOR
        /*
         * Ignore the rest of the #control line so you can write
         *      #if foo
         *      #endif  foo
         */
        dump_line( global, counter );         /* Take common exit */

        return( FPP_OK );
        #else
        if( skipws( global ) != '\n' )
            {
            cwarn( global, WARN_UNEXPECTED_TEXT_IGNORED );

            skipnl( global );
            }
        #endif
        }

    (*counter)++;

    return( FPP_OK );
}